

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O3

void Dch_PerformRandomSimulation(Aig_Man_t *pAig,Vec_Ptr_t *vSims)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void **ppvVar4;
  void *pvVar5;
  void *pvVar6;
  int *piVar7;
  void **ppvVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  Vec_Ptr_t *pVVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  
  if (1 < vSims->nSize) {
    uVar14 = pAig->pConst1->Id;
    if ((-1 < (long)(int)uVar14) && (uVar14 < (uint)vSims->nSize)) {
      ppvVar4 = vSims->pArray;
      pvVar5 = ppvVar4[1];
      pvVar6 = *ppvVar4;
      memset(ppvVar4[(int)uVar14],0xff,
             ((long)pvVar5 - (long)pvVar6) * 0x40000000 >> 0x1e & 0xfffffffffffffffc);
      pVVar12 = pAig->vCis;
      uVar14 = (uint)((ulong)((long)pvVar5 - (long)pvVar6) >> 2);
      if (0 < pVVar12->nSize) {
        lVar15 = 0;
        do {
          iVar1 = *(int *)((long)pVVar12->pArray[lVar15] + 0x24);
          if (((long)iVar1 < 0) || (vSims->nSize <= iVar1)) goto LAB_00690b14;
          piVar7 = (int *)vSims->pArray[iVar1];
          if (0 < (int)uVar14) {
            uVar16 = 0;
            do {
              uVar11 = Aig_ManRandom(0);
              piVar7[uVar16] = uVar11;
              uVar16 = uVar16 + 1;
            } while ((uVar14 & 0x7fffffff) != uVar16);
            pVVar12 = pAig->vCis;
          }
          *piVar7 = *piVar7 << 1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar12->nSize);
      }
      pVVar12 = pAig->vObjs;
      if (0 < pVVar12->nSize) {
        ppvVar4 = pVVar12->pArray;
        uVar16 = (ulong)(uVar14 & 0x7fffffff);
        lVar15 = 0;
        do {
          pvVar5 = ppvVar4[lVar15];
          if ((pvVar5 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar5 + 0x18) & 7) - 7)) {
            iVar1 = *(int *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x24);
            if (((long)iVar1 < 0) || (uVar11 = vSims->nSize, (int)uVar11 <= iVar1))
            goto LAB_00690b14;
            uVar13 = *(ulong *)((long)pvVar5 + 0x10);
            uVar2 = *(uint *)((uVar13 & 0xfffffffffffffffe) + 0x24);
            if (((long)(int)uVar2 < 0) || (uVar11 <= uVar2)) goto LAB_00690b14;
            uVar3 = *(uint *)((long)pvVar5 + 0x24);
            if (((long)(int)uVar3 < 0) || (uVar11 <= uVar3)) goto LAB_00690b14;
            ppvVar8 = vSims->pArray;
            pvVar6 = ppvVar8[iVar1];
            pvVar9 = ppvVar8[(int)uVar2];
            pvVar10 = ppvVar8[(int)uVar3];
            if ((*(ulong *)((long)pvVar5 + 8) & 1) == 0) {
              if ((uVar13 & 1) == 0) {
                if (0 < (int)uVar14) {
                  uVar13 = 0;
                  do {
                    *(uint *)((long)pvVar10 + uVar13 * 4) =
                         *(uint *)((long)pvVar9 + uVar13 * 4) & *(uint *)((long)pvVar6 + uVar13 * 4)
                    ;
                    uVar13 = uVar13 + 1;
                  } while (uVar16 != uVar13);
                }
              }
              else if (0 < (int)uVar14) {
                uVar13 = 0;
                do {
                  *(uint *)((long)pvVar10 + uVar13 * 4) =
                       ~*(uint *)((long)pvVar9 + uVar13 * 4) & *(uint *)((long)pvVar6 + uVar13 * 4);
                  uVar13 = uVar13 + 1;
                } while (uVar16 != uVar13);
              }
            }
            else if ((uVar13 & 1) == 0) {
              if (0 < (int)uVar14) {
                uVar13 = 0;
                do {
                  *(uint *)((long)pvVar10 + uVar13 * 4) =
                       ~*(uint *)((long)pvVar6 + uVar13 * 4) & *(uint *)((long)pvVar9 + uVar13 * 4);
                  uVar13 = uVar13 + 1;
                } while (uVar16 != uVar13);
              }
            }
            else if (0 < (int)uVar14) {
              uVar13 = 0;
              do {
                *(uint *)((long)pvVar10 + uVar13 * 4) =
                     ~(*(uint *)((long)pvVar9 + uVar13 * 4) | *(uint *)((long)pvVar6 + uVar13 * 4));
                uVar13 = uVar13 + 1;
              } while (uVar16 != uVar13);
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar12->nSize);
      }
      return;
    }
  }
LAB_00690b14:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Dch_PerformRandomSimulation( Aig_Man_t * pAig, Vec_Ptr_t * vSims )
{
    unsigned * pSim, * pSim0, * pSim1;
    Aig_Obj_t * pObj;
    int i, k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);

    // assign const 1 sim info
    pObj = Aig_ManConst1(pAig);
    pSim = Dch_ObjSim( vSims, pObj );
    memset( pSim, 0xff, sizeof(unsigned) * nWords );

    // assign primary input random sim info
    Aig_ManForEachCi( pAig, pObj, i )
    {
        pSim = Dch_ObjSim( vSims, pObj );
        for ( k = 0; k < nWords; k++ )
            pSim[k] = Dch_ObjRandomSim();
        pSim[0] <<= 1;
    }

    // simulate AIG in the topological order
    Aig_ManForEachNode( pAig, pObj, i )
    {
        pSim0 = Dch_ObjSim( vSims, Aig_ObjFanin0(pObj) ); 
        pSim1 = Dch_ObjSim( vSims, Aig_ObjFanin1(pObj) ); 
        pSim  = Dch_ObjSim( vSims, pObj );

        if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // both are compls
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = ~pSim0[k] & ~pSim1[k];
        }
        else if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) ) // first one is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = ~pSim0[k] & pSim1[k];
        }
        else if ( !Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // second one is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = pSim0[k] & ~pSim1[k];
        }
        else // if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // none is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = pSim0[k] & pSim1[k];
        }
    }
    // get simulation information for primary outputs
}